

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O2

void __thiscall
CCoinsViewDB::CCoinsViewDB(CCoinsViewDB *this,DBParams db_params,CoinsViewOptions options)

{
  long lVar1;
  int in_ECX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CCoinsView)._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01145378;
  DBParams::DBParams(&this->m_db_params,(DBParams *)options.batch_write_bytes);
  (this->m_options).batch_write_bytes = options._8_8_;
  (this->m_options).simulate_crash_ratio = in_ECX;
  std::make_unique<CDBWrapper,DBParams&>((DBParams *)&this->m_db);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsViewDB::CCoinsViewDB(DBParams db_params, CoinsViewOptions options) :
    m_db_params{std::move(db_params)},
    m_options{std::move(options)},
    m_db{std::make_unique<CDBWrapper>(m_db_params)} { }